

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * lest::to_string<(anonymous_namespace)::Implicit>
                   (string *__return_storage_ptr__,Implicit *value)

{
  uint *puVar1;
  int iVar2;
  ostringstream os;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  long local_198 [3];
  uint auStack_180 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  iVar2 = value->x;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Implicit:",9);
  std::ostream::operator<<((ostream *)local_198,iVar2);
  std::__cxx11::ostringstream::str();
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_1b8,local_1b8 + local_1b0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1d8,local_1d8 + local_1d0);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}